

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

Error __thiscall
llvm::dwarf::CFIProgram::parse
          (CFIProgram *this,DWARFDataExtractor Data,uint64_t *Offset,uint64_t EndOffset)

{
  DataExtractor Data_00;
  DataExtractor Data_01;
  undefined1 auVar1 [8];
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  uint8_t uVar6;
  byte bVar7;
  uint64_t uVar8;
  ulong Operand1;
  uint64_t uVar9;
  reference pvVar10;
  ulong in_RCX;
  error_code EC;
  error_code EC_00;
  Error local_178;
  char *local_170;
  char *local_168;
  size_t local_160;
  DWARFExpression local_158;
  StringRef local_138;
  StringRef local_128;
  undefined1 local_118 [8];
  DataExtractor Extractor_1;
  uint64_t BlockLength;
  uint64_t RegNum;
  DWARFExpression local_d8;
  StringRef local_b8;
  StringRef local_a8;
  undefined1 local_98 [8];
  DataExtractor Extractor;
  uint32_t ExprLength;
  uint64_t op2_1;
  uint64_t op1_1;
  uint64_t op2;
  uint64_t op1;
  error_category *local_50;
  error_code local_48;
  ulong local_38;
  uint64_t Op1;
  uint8_t Primary;
  ulong uStack_28;
  uint8_t Opcode;
  uint64_t EndOffset_local;
  uint64_t *Offset_local;
  CFIProgram *this_local;
  
  uStack_28 = in_RCX;
  EndOffset_local = EndOffset;
  Offset_local = Offset;
  this_local = this;
  do {
    while( true ) {
      while( true ) {
        if (uStack_28 <= *(ulong *)EndOffset_local) {
          Error::success();
          Error::Error((Error *)this,&local_178);
          ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_178);
          return (Error)(ErrorInfoBase *)this;
        }
        uVar8 = DWARFDataExtractor::getRelocatedValue
                          (&Data,1,(uint64_t *)EndOffset_local,(uint64_t *)0x0,(Error *)0x0);
        bVar7 = (byte)uVar8;
        Op1._6_1_ = bVar7 & 0xc0;
        Op1._7_1_ = bVar7;
        if ((uVar8 & 0xc0) != 0) break;
        switch(uVar8 & 0xff) {
        case 0:
        case 10:
        case 0xb:
        case 0x2d:
          addInstruction((CFIProgram *)Offset,bVar7);
          break;
        case 1:
          uVar8 = DWARFDataExtractor::getRelocatedAddress
                            (&Data,(uint64_t *)EndOffset_local,(uint64_t *)0x0);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        case 2:
          uVar8 = DWARFDataExtractor::getRelocatedValue
                            (&Data,1,(uint64_t *)EndOffset_local,(uint64_t *)0x0,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        case 3:
          uVar8 = DWARFDataExtractor::getRelocatedValue
                            (&Data,2,(uint64_t *)EndOffset_local,(uint64_t *)0x0,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        case 4:
          uVar8 = DWARFDataExtractor::getRelocatedValue
                            (&Data,4,(uint64_t *)EndOffset_local,(uint64_t *)0x0,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        case 5:
        case 9:
        case 0xc:
        case 0x14:
          uVar8 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          uVar9 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,Op1._7_1_,uVar8,uVar9);
          break;
        case 6:
        case 7:
        case 8:
        case 0xd:
        case 0xe:
        case 0x2e:
          uVar8 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        case 0xf:
          uVar8 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          Extractor._20_4_ = SUB84(uVar8,0);
          addInstruction((CFIProgram *)Offset,Op1._7_1_,0);
          local_b8 = DataExtractor::getData(&Data.super_DataExtractor);
          local_a8 = StringRef::slice(&local_b8,*(size_t *)EndOffset_local,
                                      *(long *)EndOffset_local + (ulong)(uint)Extractor._20_4_);
          bVar5 = DataExtractor::isLittleEndian(&Data.super_DataExtractor);
          uVar6 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
          DataExtractor::DataExtractor((DataExtractor *)local_98,local_a8,bVar5,uVar6);
          sVar3 = Extractor.Data.Length;
          pcVar2 = Extractor.Data.Data;
          auVar1 = local_98;
          bVar7 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
          sVar4 = Extractor.Data.Length;
          Data_00.Data.Length = (size_t)pcVar2;
          Data_00.Data.Data = (char *)auVar1;
          Extractor.Data.Length._0_1_ = (undefined1)sVar3;
          Extractor.Data.Length._1_1_ = SUB81(sVar3,1);
          Extractor.Data.Length._2_6_ = SUB86(sVar3,2);
          Data_00.IsLittleEndian = (undefined1)Extractor.Data.Length;
          Data_00.AddressSize = Extractor.Data.Length._1_1_;
          Data_00._18_6_ = Extractor.Data.Length._2_6_;
          Extractor.Data.Length = sVar4;
          DWARFExpression::DWARFExpression(&local_d8,Data_00,(ushort)bVar7,'\x04');
          pvVar10 = std::
                    vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
                    ::back((vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
                            *)Offset);
          Optional<llvm::DWARFExpression>::operator=(&pvVar10->Expression,&local_d8);
          *(ulong *)EndOffset_local = (ulong)(uint)Extractor._20_4_ + *(long *)EndOffset_local;
          break;
        case 0x10:
        case 0x16:
          uVar8 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          Extractor_1._16_8_ =
               DataExtractor::getULEB128
                         (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          addInstruction((CFIProgram *)Offset,Op1._7_1_,uVar8,0);
          local_138 = DataExtractor::getData(&Data.super_DataExtractor);
          local_128 = StringRef::slice(&local_138,*(size_t *)EndOffset_local,
                                       *(long *)EndOffset_local + Extractor_1._16_8_);
          bVar5 = DataExtractor::isLittleEndian(&Data.super_DataExtractor);
          uVar6 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
          DataExtractor::DataExtractor((DataExtractor *)local_118,local_128,bVar5,uVar6);
          local_170 = (char *)local_118;
          local_168 = Extractor_1.Data.Data;
          local_160 = Extractor_1.Data.Length;
          bVar7 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
          Data_01.Data.Length = (size_t)local_168;
          Data_01.Data.Data = local_170;
          Data_01.IsLittleEndian = (undefined1)local_160;
          Data_01.AddressSize = local_160._1_1_;
          Data_01._18_6_ = local_160._2_6_;
          DWARFExpression::DWARFExpression(&local_158,Data_01,(ushort)bVar7,'\x04');
          pvVar10 = std::
                    vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
                    ::back((vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
                            *)Offset);
          Optional<llvm::DWARFExpression>::operator=(&pvVar10->Expression,&local_158);
          *(long *)EndOffset_local = Extractor_1._16_8_ + *(long *)EndOffset_local;
          break;
        case 0x11:
        case 0x12:
        case 0x15:
          uVar8 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
          uVar9 = DataExtractor::getSLEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset_local);
          addInstruction((CFIProgram *)Offset,Op1._7_1_,uVar8,uVar9);
          break;
        case 0x13:
          uVar8 = DataExtractor::getSLEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset_local);
          addInstruction((CFIProgram *)Offset,bVar7,uVar8);
          break;
        default:
          std::error_code::error_code<llvm::errc,void>((error_code *)&op1,illegal_byte_sequence);
          EC_00._M_cat._0_4_ = (undefined4)op1;
          EC_00._0_8_ = this;
          EC_00._M_cat._4_4_ = 0;
          createStringError<unsigned_char>
                    (EC_00,(char *)local_50,(uchar *)"Invalid extended CFI opcode 0x%x");
          return (Error)(ErrorInfoBase *)this;
        }
      }
      Operand1 = (ulong)(bVar7 & 0x3f);
      local_38 = Operand1;
      if (Op1._6_1_ != 0x40) break;
LAB_027efab4:
      addInstruction((CFIProgram *)Offset,Op1._6_1_,Operand1);
    }
    if (Op1._6_1_ != 0x80) {
      if (Op1._6_1_ != 0xc0) {
        std::error_code::error_code<llvm::errc,void>(&local_48,illegal_byte_sequence);
        EC._M_cat._0_4_ = local_48._M_value;
        EC._0_8_ = this;
        EC._M_cat._4_4_ = 0;
        createStringError<unsigned_char>
                  (EC,(char *)local_48._M_cat,(uchar *)"Invalid primary CFI opcode 0x%x");
        return (Error)(ErrorInfoBase *)this;
      }
      goto LAB_027efab4;
    }
    uVar8 = DataExtractor::getULEB128
                      (&Data.super_DataExtractor,(uint64_t *)EndOffset_local,(Error *)0x0);
    addInstruction((CFIProgram *)Offset,0x80,Operand1,uVar8);
  } while( true );
}

Assistant:

Error CFIProgram::parse(DWARFDataExtractor Data, uint64_t *Offset,
                        uint64_t EndOffset) {
  while (*Offset < EndOffset) {
    uint8_t Opcode = Data.getRelocatedValue(1, Offset);
    // Some instructions have a primary opcode encoded in the top bits.
    uint8_t Primary = Opcode & DWARF_CFI_PRIMARY_OPCODE_MASK;

    if (Primary) {
      // If it's a primary opcode, the first operand is encoded in the bottom
      // bits of the opcode itself.
      uint64_t Op1 = Opcode & DWARF_CFI_PRIMARY_OPERAND_MASK;
      switch (Primary) {
      default:
        return createStringError(errc::illegal_byte_sequence,
                                 "Invalid primary CFI opcode 0x%" PRIx8,
                                 Primary);
      case DW_CFA_advance_loc:
      case DW_CFA_restore:
        addInstruction(Primary, Op1);
        break;
      case DW_CFA_offset:
        addInstruction(Primary, Op1, Data.getULEB128(Offset));
        break;
      }
    } else {
      // Extended opcode - its value is Opcode itself.
      switch (Opcode) {
      default:
        return createStringError(errc::illegal_byte_sequence,
                                 "Invalid extended CFI opcode 0x%" PRIx8,
                                 Opcode);
      case DW_CFA_nop:
      case DW_CFA_remember_state:
      case DW_CFA_restore_state:
      case DW_CFA_GNU_window_save:
        // No operands
        addInstruction(Opcode);
        break;
      case DW_CFA_set_loc:
        // Operands: Address
        addInstruction(Opcode, Data.getRelocatedAddress(Offset));
        break;
      case DW_CFA_advance_loc1:
        // Operands: 1-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(1, Offset));
        break;
      case DW_CFA_advance_loc2:
        // Operands: 2-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(2, Offset));
        break;
      case DW_CFA_advance_loc4:
        // Operands: 4-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(4, Offset));
        break;
      case DW_CFA_restore_extended:
      case DW_CFA_undefined:
      case DW_CFA_same_value:
      case DW_CFA_def_cfa_register:
      case DW_CFA_def_cfa_offset:
      case DW_CFA_GNU_args_size:
        // Operands: ULEB128
        addInstruction(Opcode, Data.getULEB128(Offset));
        break;
      case DW_CFA_def_cfa_offset_sf:
        // Operands: SLEB128
        addInstruction(Opcode, Data.getSLEB128(Offset));
        break;
      case DW_CFA_offset_extended:
      case DW_CFA_register:
      case DW_CFA_def_cfa:
      case DW_CFA_val_offset: {
        // Operands: ULEB128, ULEB128
        // Note: We can not embed getULEB128 directly into function
        // argument list. getULEB128 changes Offset and order of evaluation
        // for arguments is unspecified.
        auto op1 = Data.getULEB128(Offset);
        auto op2 = Data.getULEB128(Offset);
        addInstruction(Opcode, op1, op2);
        break;
        }
        case DW_CFA_offset_extended_sf:
        case DW_CFA_def_cfa_sf:
        case DW_CFA_val_offset_sf: {
          // Operands: ULEB128, SLEB128
          // Note: see comment for the previous case
          auto op1 = Data.getULEB128(Offset);
          auto op2 = (uint64_t)Data.getSLEB128(Offset);
          addInstruction(Opcode, op1, op2);
          break;
        }
        case DW_CFA_def_cfa_expression: {
          uint32_t ExprLength = Data.getULEB128(Offset);
          addInstruction(Opcode, 0);
          DataExtractor Extractor(
              Data.getData().slice(*Offset, *Offset + ExprLength),
              Data.isLittleEndian(), Data.getAddressSize());
          Instructions.back().Expression = DWARFExpression(
              Extractor, Data.getAddressSize(), dwarf::DWARF_VERSION);
          *Offset += ExprLength;
          break;
        }
        case DW_CFA_expression:
        case DW_CFA_val_expression: {
          auto RegNum = Data.getULEB128(Offset);
          auto BlockLength = Data.getULEB128(Offset);
          addInstruction(Opcode, RegNum, 0);
          DataExtractor Extractor(
              Data.getData().slice(*Offset, *Offset + BlockLength),
              Data.isLittleEndian(), Data.getAddressSize());
          Instructions.back().Expression = DWARFExpression(
              Extractor, Data.getAddressSize(), dwarf::DWARF_VERSION);
          *Offset += BlockLength;
          break;
        }
      }
    }
  }

  return Error::success();
}